

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

FunctionDeclarationSyntax * __thiscall
slang::parsing::Parser::parseFunctionDeclaration
          (Parser *this,AttrList attributes,SyntaxKind functionKind,TokenKind endKind,
          SyntaxKind parentKind)

{
  SyntaxNode *this_00;
  Token end_00;
  FunctionPrototypeSyntax *prototype;
  NamedBlockClauseSyntax *endBlock;
  FunctionDeclarationSyntax *pFVar1;
  Token TVar2;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar3;
  Token semi;
  bool isConstructor;
  Token end;
  bool local_bd;
  SyntaxKind local_bc;
  pointer local_b8;
  Info *local_b0;
  undefined8 local_a8;
  Token local_a0;
  SyntaxList<slang::syntax::SyntaxNode> local_90;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  local_b8 = attributes.data_;
  local_bc = functionKind;
  Token::Token(&local_a0);
  prototype = parseFunctionPrototype
                        (this,parentKind,(bitmask<slang::parsing::detail::FunctionOptions>)0x5,
                         &local_bd);
  TVar2 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_b0 = TVar2.info;
  local_a8 = TVar2._0_8_;
  sVar3 = parseBlockItems(this,endKind,&local_a0,local_bd);
  endBlock = parseNamedBlockClause(this);
  this_00 = (SyntaxNode *)(prototype->name).ptr;
  if (this_00 != (SyntaxNode *)0x0) {
    TVar2 = slang::syntax::SyntaxNode::getLastToken(this_00);
    if ((TVar2.kind == NewKeyword) || (TVar2.kind == Identifier)) {
      checkBlockNames(this,TVar2,endBlock);
    }
    local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         local_b8;
    local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
    local_90.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_90.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_90.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050ae90;
    end_00.info = local_a0.info;
    end_00.kind = local_a0.kind;
    end_00._2_1_ = local_a0._2_1_;
    end_00.numFlags.raw = local_a0.numFlags.raw;
    end_00.rawLen = local_a0.rawLen;
    semi.info = local_b0;
    semi.kind = (undefined2)local_a8;
    semi._2_1_ = local_a8._2_1_;
    semi.numFlags.raw = local_a8._3_1_;
    semi.rawLen = local_a8._4_4_;
    local_90.super_SyntaxListBase.childCount = sVar3.size_;
    local_90.super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> = sVar3;
    local_60.super_SyntaxListBase.childCount = attributes.size_;
    local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
         attributes.size_;
    pFVar1 = slang::syntax::SyntaxFactory::functionDeclaration
                       (&this->factory,local_bc,&local_60,prototype,semi,&local_90,end_00,endBlock);
    return pFVar1;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
            );
}

Assistant:

FunctionDeclarationSyntax& Parser::parseFunctionDeclaration(AttrList attributes,
                                                            SyntaxKind functionKind,
                                                            TokenKind endKind,
                                                            SyntaxKind parentKind) {
    Token end;
    bool isConstructor;
    auto& prototype = parseFunctionPrototype(parentKind,
                                             FunctionOptions::AllowImplicitReturn |
                                                 FunctionOptions::AllowTasks,
                                             &isConstructor);

    auto semi = expect(TokenKind::Semicolon);
    auto items = parseBlockItems(endKind, end, isConstructor);
    auto endBlockName = parseNamedBlockClause();

    Token nameToken = prototype.name->getLastToken();
    if (nameToken.kind == TokenKind::Identifier || nameToken.kind == TokenKind::NewKeyword)
        checkBlockNames(nameToken, endBlockName);

    return factory.functionDeclaration(functionKind, attributes, prototype, semi, items, end,
                                       endBlockName);
}